

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGB,cBGRA,bCopyAlpha>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  undefined2 uVar3;
  int iVar4;
  EBlend EVar5;
  FSpecialColormap *pFVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  BYTE *pBVar13;
  byte *pbVar14;
  
  pFVar6 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_004da6b7_caseD_0:
    lVar10 = 0;
    if (count < 1) {
      count = 0;
    }
    pBVar13 = pin + 2;
    for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
      pout[lVar10 * 4 + 2] = pBVar13[-2];
      pout[lVar10 * 4 + 1] = pBVar13[-1];
      pout[lVar10 * 4] = *pBVar13;
      pout[lVar10 * 4 + 3] = 0xff;
      pBVar13 = pBVar13 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_004da6b7_caseD_0;
    case BLEND_ICEMAP:
      lVar10 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
        iVar11 = cRGB::Gray(pin);
        pout[lVar10 * 4 + 2] = IcePalette[iVar11 >> 4][0];
        *(ushort *)(pout + lVar10 * 4) =
             *(ushort *)(IcePalette[iVar11 >> 4] + 1) << 8 |
             *(ushort *)(IcePalette[iVar11 >> 4] + 1) >> 8;
        pout[lVar10 * 4 + 3] = 0xff;
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar10 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar14 = pin + 2;
      for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
        iVar11 = inf->blendcolor[3];
        bVar1 = pbVar14[-1];
        iVar8 = inf->blendcolor[1];
        bVar2 = *pbVar14;
        iVar4 = inf->blendcolor[2];
        pout[lVar10 * 4 + 2] = (BYTE)((uint)pbVar14[-2] * iVar11 + inf->blendcolor[0] >> 0x10);
        pout[lVar10 * 4 + 1] = (BYTE)((uint)bVar1 * iVar11 + iVar8 >> 0x10);
        pout[lVar10 * 4] = (BYTE)((uint)bVar2 * iVar11 + iVar4 >> 0x10);
        pout[lVar10 * 4 + 3] = 0xff;
        pbVar14 = pbVar14 + step;
      }
      break;
    case BLEND_MODULATE:
      lVar10 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar14 = pin + 2;
      for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
        bVar1 = pbVar14[-1];
        iVar11 = inf->blendcolor[1];
        bVar2 = *pbVar14;
        iVar8 = inf->blendcolor[2];
        pout[lVar10 * 4 + 2] = (BYTE)((uint)pbVar14[-2] * inf->blendcolor[0] >> 0x10);
        pout[lVar10 * 4 + 1] = (BYTE)((uint)bVar1 * iVar11 >> 0x10);
        pout[lVar10 * 4] = (BYTE)((uint)bVar2 * iVar8 >> 0x10);
        pout[lVar10 * 4 + 3] = 0xff;
        pbVar14 = pbVar14 + step;
      }
      break;
    default:
      EVar5 = inf->blend;
      lVar10 = (long)EVar5;
      if (lVar10 < 0x21) {
        if (BLEND_ICEMAP < EVar5) {
          iVar11 = 0x20 - EVar5;
          lVar10 = 0;
          if (count < 1) {
            count = 0;
          }
          for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
            iVar8 = cRGB::Gray(pin);
            iVar8 = iVar8 * (EVar5 + BLEND_MODULATE);
            bVar1 = pin[1];
            bVar2 = pin[2];
            pout[lVar10 * 4 + 2] = (BYTE)((int)((uint)*pin * iVar11 + iVar8) / 0x1f);
            pout[lVar10 * 4 + 1] = (BYTE)((int)((uint)bVar1 * iVar11 + iVar8) / 0x1f);
            pout[lVar10 * 4] = (BYTE)((int)((uint)bVar2 * iVar11 + iVar8) / 0x1f);
            pout[lVar10 * 4 + 3] = 0xff;
            pin = pin + step;
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar12 = 0; count != (int)lVar12; lVar12 = lVar12 + 1) {
          uVar7 = cRGB::Gray(pin);
          uVar9 = 0xff;
          if (uVar7 < 0xff) {
            uVar9 = uVar7;
          }
          if ((int)uVar7 < 1) {
            uVar9 = 0;
          }
          uVar3 = *(undefined2 *)((long)pFVar6 + (ulong)uVar9 * 4 + lVar10 * 0x518 + -0xa700);
          pout[lVar12 * 4 + 2] =
               *(BYTE *)((long)pFVar6 + (ulong)uVar9 * 4 + lVar10 * 0x518 + -0xa6fe);
          *(undefined2 *)(pout + lVar12 * 4) = uVar3;
          pout[lVar12 * 4 + 3] = 0xff;
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}